

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

bool handle_command_args(int argc,char **argv,Arguments *args)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_7a4;
  allocator local_7a3;
  allocator local_7a2;
  allocator local_7a1;
  string local_7a0;
  string local_780;
  string local_760;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  ValueArg<unsigned_long> limitArg;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fileArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  codepageArg;
  SwitchArg verboseArg;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> typeArg
  ;
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  allowedVals;
  CmdLine cmd;
  ValueArg<char> separatorArg;
  
  std::__cxx11::string::string
            ((string *)&typeArg,"Convert a TSV or CSV file to a \'clean\' UTF-8 encoded TSV output",
             (allocator *)&fileArg);
  std::__cxx11::string::string((string *)&codepageArg,"0.1",(allocator *)&limitArg);
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&typeArg,' ',(string *)&codepageArg,true);
  std::__cxx11::string::~string((string *)&codepageArg);
  std::__cxx11::string::~string((string *)&typeArg);
  std::__cxx11::string::string((string *)&typeArg,"csv",(allocator *)&codepageArg);
  std::__cxx11::string::string
            ((string *)(typeArg.super_Arg._flag.field_2._M_local_buf + 8),"tsv",
             (allocator *)&fileArg);
  __l._M_len = 2;
  __l._M_array = (iterator)&typeArg;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&allowed,__l,(allocator_type *)&limitArg);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&typeArg.super_Arg._vptr_Arg + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValuesConstraint(&allowedVals,&allowed);
  std::__cxx11::string::string((string *)&codepageArg,"t",(allocator *)&separatorArg);
  std::__cxx11::string::string((string *)&fileArg,"type",(allocator *)&verboseArg);
  std::__cxx11::string::string((string *)&limitArg,"The type of input file",(allocator *)&local_7a0)
  ;
  std::__cxx11::string::string((string *)&local_6e8,"csv",(allocator *)&local_780);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&typeArg,(string *)&codepageArg,(string *)&fileArg,(string *)&limitArg,false,&local_6e8
             ,&allowedVals.
               super_Constraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&limitArg);
  std::__cxx11::string::~string((string *)&fileArg);
  std::__cxx11::string::~string((string *)&codepageArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&typeArg);
  std::__cxx11::string::string((string *)&codepageArg,"s",(allocator *)&local_7a0);
  std::__cxx11::string::string((string *)&fileArg,"separator",(allocator *)&local_780);
  std::__cxx11::string::string
            ((string *)&limitArg,"Separator character to use when decoding",(allocator *)&local_760)
  ;
  std::__cxx11::string::string((string *)&verboseArg,"separator character",&local_7a4);
  TCLAP::ValueArg<char>::ValueArg
            (&separatorArg,(string *)&codepageArg,(string *)&fileArg,(string *)&limitArg,false,',',
             (string *)&verboseArg,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&verboseArg);
  std::__cxx11::string::~string((string *)&limitArg);
  std::__cxx11::string::~string((string *)&fileArg);
  std::__cxx11::string::~string((string *)&codepageArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&separatorArg);
  std::__cxx11::string::string((string *)&fileArg,"c",(allocator *)&local_780);
  std::__cxx11::string::string((string *)&limitArg,"codepage",(allocator *)&local_760);
  std::__cxx11::string::string
            ((string *)&verboseArg,
             "The codepage to decode the input file if automatic detection doesn\'t work",&local_7a4
            );
  std::__cxx11::string::string((string *)&local_708,"",&local_7a2);
  std::__cxx11::string::string((string *)&local_7a0,"codepage",&local_7a3);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&codepageArg,(string *)&fileArg,(string *)&limitArg,(string *)&verboseArg,false,
             &local_708,&local_7a0,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&verboseArg);
  std::__cxx11::string::~string((string *)&limitArg);
  std::__cxx11::string::~string((string *)&fileArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&codepageArg);
  std::__cxx11::string::string((string *)&fileArg,"v",(allocator *)&local_780);
  std::__cxx11::string::string((string *)&limitArg,"verbose",(allocator *)&local_760);
  std::__cxx11::string::string
            ((string *)&local_7a0,"Display a progress bar during parsing",&local_7a4);
  TCLAP::SwitchArg::SwitchArg
            (&verboseArg,(string *)&fileArg,(string *)&limitArg,&local_7a0,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&limitArg);
  std::__cxx11::string::~string((string *)&fileArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&verboseArg);
  std::__cxx11::string::string((string *)&fileArg,"l",&local_7a4);
  std::__cxx11::string::string((string *)&local_7a0,"limit",&local_7a2);
  std::__cxx11::string::string((string *)&local_780,"limit to the first <limit> records",&local_7a3)
  ;
  std::__cxx11::string::string((string *)&local_760,"limit",&local_7a1);
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&limitArg,(string *)&fileArg,&local_7a0,&local_780,false,0,&local_760,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&fileArg);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&limitArg);
  std::__cxx11::string::string((string *)&local_7a0,"file",&local_7a4);
  std::__cxx11::string::string((string *)&local_780,"input file",&local_7a2);
  std::__cxx11::string::string((string *)&local_728,"filenameString",&local_7a3);
  std::__cxx11::string::string((string *)&local_760,"value",&local_7a1);
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&fileArg,&local_7a0,&local_780,true,&local_728,&local_760,false,(Visitor *)0x0
                     );
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd,&fileArg);
  TCLAP::CmdLine::parse(&cmd,argc,argv);
  std::__cxx11::string::_M_assign((string *)args);
  args->verbose = (bool)verboseArg.super_Arg._163_1_;
  std::__cxx11::string::_M_assign((string *)&args->inputFile);
  args->limit = limitArg._value;
  std::__cxx11::string::_M_assign((string *)&args->codepage);
  args->separator = separatorArg.super_Arg._163_1_;
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&fileArg.
               super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  TCLAP::ValueArg<unsigned_long>::~ValueArg(&limitArg);
  TCLAP::Arg::~Arg(&verboseArg.super_Arg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&codepageArg);
  TCLAP::ValueArg<char>::~ValueArg(&separatorArg);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&typeArg);
  TCLAP::
  ValuesConstraint<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValuesConstraint(&allowedVals);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&allowed);
  TCLAP::CmdLine::~CmdLine(&cmd);
  return true;
}

Assistant:

bool handle_command_args(int argc, const char * const * argv, Arguments& args) {
	try {
		TCLAP::CmdLine cmd("Convert a TSV or CSV file to a 'clean' UTF-8 encoded TSV output", ' ', "0.1");
		
		std::vector<std::string> allowed { "csv", "tsv" };
		TCLAP::ValuesConstraint<std::string> allowedVals( allowed );
		TCLAP::ValueArg<std::string> typeArg("t", "type", "The type of input file", false, "csv", &allowedVals);
		cmd.add( typeArg );

		TCLAP::ValueArg<char> separatorArg("s", "separator", "Separator character to use when decoding", false, ',', "separator character");
		cmd.add( separatorArg );

		TCLAP::ValueArg<std::string> codepageArg("c", "codepage", "The codepage to decode the input file if automatic detection doesn't work", false, "", "codepage");
		cmd.add( codepageArg );

		TCLAP::SwitchArg verboseArg("v", "verbose", "Display a progress bar during parsing");
		cmd.add( verboseArg );
		TCLAP::ValueArg<size_t> limitArg("l", "limit", "limit to the first <limit> records", false, 0, "limit");
		cmd.add( limitArg );
		TCLAP::UnlabeledValueArg<std::string> fileArg("file", "input file", true, "filenameString", "value");
		cmd.add( fileArg );
		
		// Parse the argv array.
		cmd.parse( argc, argv );
		
		args.type = typeArg.getValue();
		args.verbose = verboseArg.getValue();
		args.inputFile = fileArg.getValue();
		args.limit = limitArg.getValue();
		args.codepage = codepageArg.getValue();
		args.separator = separatorArg.getValue();
	}
	catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return false;
	}
	return true;
}